

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::generateStaticMetacall(Generator *this)

{
  QCommonArrayOps<FunctionDef> *this_00;
  int iVar1;
  FunctionDef *pFVar2;
  PropertyDef *pPVar3;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar4;
  bool bVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  uint uVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  const_iterator cVar19;
  _Rb_tree_node_base *p_Var20;
  _Base_ptr *pp_Var21;
  FILE *pFVar22;
  char *pcVar23;
  QByteArray *pQVar24;
  ClassDef *pCVar25;
  undefined8 *puVar26;
  _Base_ptr p_Var27;
  long lVar28;
  byte bVar29;
  char *pcVar30;
  size_t __size;
  qsizetype *lhs;
  byte bVar31;
  char *pcVar32;
  ClassDef *pCVar33;
  undefined8 *puVar34;
  ArgumentDef *pAVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  _Rb_tree_node_base *p_Var39;
  long lVar40;
  bool bVar41;
  ArgumentDef *a;
  bool *pbVar42;
  ArgumentDef *pAVar43;
  long in_FS_OFFSET;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QMultiMap<QByteArray,_int> automaticPropertyMetaTypes;
  QMap<int,_QMultiMap<QByteArray,_int>_> methodsWithAutomaticTypes;
  long local_b0;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  local_90;
  undefined1 local_88 [56];
  undefined1 local_50 [16];
  QByteArray *local_40;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  pcVar23 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar23 == (char *)0x0) {
    pcVar23 = (char *)&QByteArray::_empty;
  }
  bVar10 = false;
  bVar9 = false;
  bVar13 = false;
  fprintf((FILE *)this->out,
          "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar23);
  pcVar23 = (this->cdef->super_BaseDef).classname.d.ptr;
  if (pcVar23 == (char *)0x0) {
    pcVar23 = (char *)&QByteArray::_empty;
  }
  pcVar30 = "    auto *_t = reinterpret_cast<%s *>(_o);\n";
  if (this->cdef->hasQObject != false) {
    pcVar30 = "    auto *_t = static_cast<%s *>(_o);\n";
  }
  fprintf((FILE *)this->out,pcVar30,pcVar23);
  if ((this->cdef->constructorList).d.size != 0) {
    fwrite("    if (_c == QMetaObject::CreateInstance) {\n",0x2d,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    uVar16 = (uint)(this->cdef->constructorList).d.size;
    if (0 < (int)uVar16) {
      uVar38 = 0;
      do {
        pcVar23 = (this->cdef->super_BaseDef).classname.d.ptr;
        if (pcVar23 == (char *)0x0) {
          pcVar23 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"        case %d: { %s *_r = new %s(",uVar38 & 0xffffffff,pcVar23,
                pcVar23);
        pFVar2 = (this->cdef->constructorList).d.ptr;
        lVar28 = pFVar2[uVar38].arguments.d.size;
        if (lVar28 != 0) {
          pAVar43 = pFVar2[uVar38].arguments.d.ptr;
          pAVar35 = pAVar43 + lVar28;
          lVar28 = 0;
          uVar37 = 1;
          do {
            if (lVar28 != 0) {
              fputc(0x2c,(FILE *)this->out);
            }
            pcVar23 = (pAVar43->typeNameForCast).d.ptr;
            if (pcVar23 == (char *)0x0) {
              pcVar23 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,"(*reinterpret_cast<%s>(_a[%d]))",pcVar23,(ulong)uVar37);
            pAVar43 = pAVar43 + 1;
            lVar28 = lVar28 + -0xa8;
            uVar37 = uVar37 + 1;
          } while (pAVar43 != pAVar35);
        }
        fwrite(");\n",3,1,(FILE *)this->out);
        pcVar23 = anon_var_dwarf_3fa62;
        if ((this->cdef->hasQGadget == false) &&
           (pcVar23 = "QObject", this->cdef->hasQNamespace != false)) {
          pcVar23 = anon_var_dwarf_3fa62;
        }
        fprintf((FILE *)this->out,
                "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",pcVar23);
        uVar38 = uVar38 + 1;
      } while (uVar38 != (uVar16 & 0x7fffffff));
    }
    fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    fwrite("    if (_c == QMetaObject::ConstructInPlace) {\n",0x2f,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    if (0 < (int)uVar16) {
      uVar38 = 0;
      do {
        pcVar23 = (this->cdef->super_BaseDef).classname.d.ptr;
        if (pcVar23 == (char *)0x0) {
          pcVar23 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"        case %d: { new (_a[0]) %s(",uVar38 & 0xffffffff,pcVar23);
        pFVar2 = (this->cdef->constructorList).d.ptr;
        lVar28 = pFVar2[uVar38].arguments.d.size;
        if (lVar28 != 0) {
          pAVar43 = pFVar2[uVar38].arguments.d.ptr;
          pAVar35 = pAVar43 + lVar28;
          lVar28 = 0;
          uVar37 = 1;
          do {
            if (lVar28 != 0) {
              fputc(0x2c,(FILE *)this->out);
            }
            pcVar23 = (pAVar43->typeNameForCast).d.ptr;
            if (pcVar23 == (char *)0x0) {
              pcVar23 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,"(*reinterpret_cast<%s>(_a[%d]))",pcVar23,(ulong)uVar37);
            pAVar43 = pAVar43 + 1;
            lVar28 = lVar28 + -0xa8;
            uVar37 = uVar37 + 1;
          } while (pAVar43 != pAVar35);
        }
        fwrite("); } break;\n",0xc,1,(FILE *)this->out);
        uVar38 = uVar38 + 1;
      } while (uVar38 != (uVar16 & 0x7fffffff));
    }
    fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    bVar10 = true;
    bVar9 = true;
    bVar13 = true;
  }
  bVar8 = false;
  this_00 = (QCommonArrayOps<FunctionDef> *)(local_88 + 0x20);
  local_88._32_8_ = (uint *)0x0;
  local_88._40_8_ = (Data *)0x0;
  local_88._48_8_ = (QByteArray *)0x0;
  pFVar2 = (this->cdef->signalList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->signalList).d.size);
  pFVar2 = (this->cdef->slotList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->slotList).d.size);
  pFVar2 = (this->cdef->methodList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->methodList).d.size);
  if ((QByteArray *)local_88._48_8_ != (QByteArray *)0x0) {
    fwrite("    if (_c == QMetaObject::InvokeMetaMethod) {\n",0x2f,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    if ((QByteArray *)local_88._48_8_ != (QByteArray *)0x0) {
      pQVar24 = (QByteArray *)0x0;
      do {
        uVar11 = local_88._40_8_;
        fprintf((FILE *)this->out,"        case %d: ");
        lhs = &(((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData).alloc;
        local_88._0_8_ = anon_var_dwarf_3fa62;
        bVar13 = operator!=((QByteArray *)lhs,(char **)local_88);
        if (bVar13) {
          pFVar22 = (FILE *)this->out;
          pCVar25 = (ClassDef *)
                    (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData).alloc;
          if ((pCVar25 == (ClassDef *)0x0) ||
             ((*(storage_type **)
                &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData + -1)
              [(long)pCVar25] != '&')) {
            local_88._0_8_ =
                 (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData).alloc;
            local_88._8_8_ =
                 *(undefined8 *)
                  &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData;
            local_88._16_8_ = pCVar25;
            if ((Moc *)local_88._0_8_ != (Moc *)0x0) {
              LOCK();
              *(int *)&(((Parser *)
                        &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                           *)local_88._0_8_)->super_QSharedData)->symbols).d.d =
                   *(int *)&(((Parser *)
                             &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                                *)local_88._0_8_)->super_QSharedData)->symbols).d.d + 1;
              UNLOCK();
            }
          }
          else {
            QVar47.m_data =
                 *(storage_type **)
                  &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData;
            QVar47.m_size = (qsizetype)pCVar25;
            QVar49.m_data = "&&";
            QVar49.m_size = 2;
            cVar14 = QtPrivate::endsWith(QVar47,QVar49);
            if (cVar14 == '\0') {
              pbVar42 = &pCVar25[-1].requireCompleteMethodTypes;
            }
            else {
              pbVar42 = &pCVar25[-1].hasQNamespace;
            }
            QByteArray::left((QByteArray *)local_88,(QByteArray *)lhs,(qsizetype)pbVar42);
          }
          pCVar25 = (ClassDef *)local_88._8_8_;
          if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
            pCVar25 = (ClassDef *)&QByteArray::_empty;
          }
          fprintf(pFVar22,"{ %s _r = ",pCVar25);
          if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)local_88._0_8_ !=
              (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
        }
        fwrite("_t->",4,1,(FILE *)this->out);
        lVar28._0_4_ = (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 0xb) * 0x10))->super_QArrayData).
                       ref_;
        lVar28._4_4_ = (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 0xb) * 0x10))->super_QArrayData).
                       flags;
        if (lVar28 != 0) {
          puVar26 = (undefined8 *)
                    (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 10) * 0x10))->super_QArrayData).alloc
          ;
          if (puVar26 == (undefined8 *)0x0) {
            puVar26 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,"%s->",puVar26);
        }
        puVar26 = *(undefined8 **)
                   &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 9) * 0x10))->super_QArrayData;
        if (puVar26 == (undefined8 *)0x0) {
          puVar26 = &QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"%s(",puVar26);
        if (*(undefined1 *)
             ((long)&(((Data *)(uVar11 + ((long)pQVar24 * 0xd + 0xc) * 0x10))->super_QArrayData).
                     alloc + 7) == '\x01') {
          fwrite("QMethodRawArguments{ _a }",0x19,1,(FILE *)this->out);
          bVar10 = true;
        }
        else {
          if (*(long *)&((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData != 0
             ) {
            lVar28 = (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 4) * 0x10))->super_QArrayData).alloc
            ;
            lVar40 = lVar28 + *(long *)&((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->
                                        super_QArrayData * 0xa8;
            lVar36 = 0;
            uVar16 = 1;
            do {
              if (lVar36 != 0) {
                fputc(0x2c,(FILE *)this->out);
              }
              puVar26 = *(undefined8 **)(lVar28 + 0x90);
              if (puVar26 == (undefined8 *)0x0) {
                puVar26 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,"(*reinterpret_cast< %s>(_a[%d]))",puVar26,(ulong)uVar16);
              lVar28 = lVar28 + 0xa8;
              lVar36 = lVar36 + -0xa8;
              uVar16 = uVar16 + 1;
            } while (lVar28 != lVar40);
            bVar10 = true;
          }
          if (*(undefined1 *)
               ((long)&(((Data *)(uVar11 + ((long)pQVar24 * 0xd + 0xc) * 0x10))->super_QArrayData).
                       alloc + 3) != '\0') {
            lVar40._0_4_ = (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData)
                           .ref_;
            lVar40._4_4_ = (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData)
                           .flags;
            if (lVar40 != 0) {
              fwrite(", ",2,1,(FILE *)this->out);
            }
            fputs("QPrivateSignal()",(FILE *)this->out);
          }
        }
        fwrite(");",2,1,(FILE *)this->out);
        local_88._0_8_ = anon_var_dwarf_3fa62;
        bVar13 = operator!=((QByteArray *)lhs,(char **)local_88);
        if (bVar13) {
          pFVar22 = (FILE *)this->out;
          pCVar25 = (ClassDef *)
                    (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData).alloc;
          if ((pCVar25 == (ClassDef *)0x0) ||
             ((*(storage_type **)
                &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData + -1)
              [(long)pCVar25] != '&')) {
            local_88._0_8_ =
                 (((Data *)(uVar11 + ((long)pQVar24 * 0xd + 5) * 0x10))->super_QArrayData).alloc;
            local_88._8_8_ =
                 *(undefined8 *)
                  &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData;
            local_88._16_8_ = pCVar25;
            if ((Moc *)local_88._0_8_ != (Moc *)0x0) {
              LOCK();
              *(int *)&(((Parser *)
                        &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                           *)local_88._0_8_)->super_QSharedData)->symbols).d.d =
                   *(int *)&(((Parser *)
                             &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                                *)local_88._0_8_)->super_QSharedData)->symbols).d.d + 1;
              UNLOCK();
            }
          }
          else {
            QVar48.m_data =
                 *(storage_type **)
                  &((Data *)(uVar11 + ((long)pQVar24 * 0xd + 6) * 0x10))->super_QArrayData;
            QVar48.m_size = (qsizetype)pCVar25;
            QVar50.m_data = "&&";
            QVar50.m_size = 2;
            cVar14 = QtPrivate::endsWith(QVar48,QVar50);
            if (cVar14 == '\0') {
              pbVar42 = &pCVar25[-1].requireCompleteMethodTypes;
            }
            else {
              pbVar42 = &pCVar25[-1].hasQNamespace;
            }
            QByteArray::left((QByteArray *)local_88,(QByteArray *)lhs,(qsizetype)pbVar42);
          }
          pCVar25 = (ClassDef *)local_88._8_8_;
          if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
            pCVar25 = (ClassDef *)&QByteArray::_empty;
          }
          fprintf(pFVar22,
                  "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                  pCVar25);
          if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)local_88._0_8_ !=
              (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
          bVar10 = true;
        }
        fwrite(" break;\n",8,1,(FILE *)this->out);
        pQVar24 = (QByteArray *)
                  ((long)&(((QBasicAtomicInt *)&(pQVar24->d).d)->_q_value).super___atomic_base<int>.
                          _M_i + 1);
      } while (pQVar24 < (ulong)local_88._48_8_);
    }
    fwrite("        default: ;\n",0x13,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    methodsWithAutomaticTypesHelper((Generator *)local_88,(QList<FunctionDef> *)this);
    if (((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
          *)local_88._0_8_ !=
         (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
          *)0x0) &&
       (lVar36._0_4_ = ((QArrayData *)(local_88._0_8_ + 0x30))->ref_,
       lVar36._4_4_ = ((QArrayData *)(local_88._0_8_ + 0x30))->flags, lVar36 != 0)) {
      fwrite("    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n",0x3d,1,
             (FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      fwrite("        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",0x4d,1
             ,(FILE *)this->out);
      if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)local_88._0_8_ ==
          (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)0x0) {
        p_Var18 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var18 = *(_Rb_tree_node_base **)(local_88._0_8_ + 0x20);
      }
      p_Var20 = (_Rb_tree_node_base *)(local_88._0_8_ + 0x10);
      if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)local_88._0_8_ ==
          (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)0x0) {
        p_Var20 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var18 != p_Var20; p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
        fprintf((FILE *)this->out,"        case %d:\n",(ulong)p_Var18[1]._M_color);
        fwrite("            switch (*reinterpret_cast<int*>(_a[1])) {\n",0x36,1,(FILE *)this->out);
        fwrite("            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",
               0x51,1,(FILE *)this->out);
        p_Var27 = p_Var18[1]._M_parent;
        if (p_Var27 == (_Base_ptr)0x0) {
          p_Var17 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var17 = *(_Rb_tree_node_base **)(p_Var27 + 1);
        }
        p_Var39 = (_Rb_tree_node_base *)&p_Var27->_M_left;
        if (p_Var27 == (_Base_ptr)0x0) {
          p_Var39 = (_Rb_tree_node_base *)0x0;
        }
        while (p_Var7 = p_Var17, p_Var7 != p_Var39) {
          fprintf((FILE *)this->out,"            case %d:\n",(ulong)*(uint *)&p_Var7[1]._M_right);
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          if ((p_Var17 == p_Var39) ||
             (bVar13 = operator!=((QByteArray *)(p_Var17 + 1),(QByteArray *)(p_Var7 + 1)), bVar13))
          {
            p_Var27 = p_Var7[1]._M_parent;
            if (p_Var27 == (_Base_ptr)0x0) {
              p_Var27 = (_Base_ptr)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n"
                    ,p_Var27);
          }
        }
        fwrite("            }\n",0xe,1,(FILE *)this->out);
        fwrite("            break;\n",0x13,1,(FILE *)this->out);
      }
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
      bVar10 = true;
    }
    bVar9 = true;
    bVar13 = true;
    bVar8 = true;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_88);
  }
  if ((this->cdef->signalList).d.size != 0) {
    fwrite("    if (_c == QMetaObject::IndexOfMethod) {\n",0x2c,1,(FILE *)this->out);
    pCVar25 = this->cdef;
    if (0 < (int)(pCVar25->signalList).d.size) {
      lVar28 = 0;
      do {
        pFVar2 = (pCVar25->signalList).d.ptr;
        if (((pFVar2[lVar28].wasCloned == false) && (pFVar2[lVar28].inPrivateClass.d.size == 0)) &&
           (pFVar2[lVar28].isStatic == false)) {
          pcVar23 = pFVar2[lVar28].type.rawName.d.ptr;
          if (pcVar23 == (char *)0x0) {
            pcVar23 = (char *)&QByteArray::_empty;
          }
          pcVar30 = (pCVar25->super_BaseDef).classname.d.ptr;
          if (pcVar30 == (char *)0x0) {
            pcVar30 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,"        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",pcVar23,
                  pcVar30);
          lVar40 = pFVar2[lVar28].arguments.d.size;
          if (lVar40 != 0) {
            pAVar43 = pFVar2[lVar28].arguments.d.ptr;
            pAVar35 = pAVar43 + lVar40;
            lVar40 = 0;
            do {
              if (lVar40 != 0) {
                fwrite(", ",2,1,(FILE *)this->out);
              }
              pFVar22 = (FILE *)this->out;
              local_40 = &pAVar43->rightType;
              local_50[8] = 0x20;
              local_50._0_8_ = pAVar43;
              QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>::
              convertTo<QByteArray>
                        ((QByteArray *)local_88,
                         (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>
                          *)local_50);
              pCVar25 = (ClassDef *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pCVar25 = (ClassDef *)&QByteArray::_empty;
              }
              fputs((char *)pCVar25,pFVar22);
              if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                   *)local_88._0_8_ !=
                  (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                   *)0x0) {
                LOCK();
                *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
                UNLOCK();
                if (*(int *)local_88._0_8_ == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
                }
              }
              pAVar43 = pAVar43 + 1;
              lVar40 = lVar40 + -0xa8;
            } while (pAVar43 != pAVar35);
          }
          if (pFVar2[lVar28].isPrivateSignal != false) {
            if (pFVar2[lVar28].arguments.d.size != 0) {
              fwrite(", ",2,1,(FILE *)this->out);
            }
            fputs("QPrivateSignal",(FILE *)this->out);
          }
          pcVar23 = "";
          if (pFVar2[lVar28].isConst != false) {
            pcVar23 = " const";
          }
          pcVar30 = (this->cdef->super_BaseDef).classname.d.ptr;
          if (pcVar30 == (char *)0x0) {
            pcVar30 = (char *)&QByteArray::_empty;
          }
          pcVar32 = pFVar2[lVar28].name.d.ptr;
          if (pcVar32 == (char *)0x0) {
            pcVar32 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,")%s>(_a, &%s::%s, %d))\n",pcVar23,pcVar30,pcVar32);
          fwrite("            return;\n",0x14,1,(FILE *)this->out);
        }
        lVar28 = lVar28 + 1;
        pCVar25 = this->cdef;
      } while (lVar28 < (int)(pCVar25->signalList).d.size);
    }
    bVar10 = true;
    bVar13 = true;
    fwrite("    }\n",6,1,(FILE *)this->out);
  }
  local_90.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
        )&DAT_aaaaaaaaaaaaaaaa;
  automaticPropertyMetaTypesHelper((Generator *)&local_90);
  if ((local_90.d.ptr !=
       (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
        *)0x0) && (*(IncludePath **)((long)local_90.d.ptr + 0x30) != (IncludePath *)0x0)) {
    fwrite("    if (_c == QMetaObject::RegisterPropertyMetaType) {\n",0x37,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    fwrite("        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n",0x3d,1,(FILE *)this->out
          );
    if (local_90.d.ptr ==
        (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
         *)0x0) {
      p_Var18 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var18 = *(_Base_ptr *)((long)local_90.d.ptr + 0x20);
    }
    p_Var20 = (_Rb_tree_node_base *)((long)local_90.d.ptr + 0x10);
    if (local_90.d.ptr ==
        (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
         *)0x0) {
      p_Var20 = (_Rb_tree_node_base *)0x0;
    }
    while (p_Var17 = p_Var18, p_Var17 != p_Var20) {
      fprintf((FILE *)this->out,"        case %d:\n",(ulong)*(uint *)&p_Var17[1]._M_right);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      if ((p_Var18 == p_Var20) ||
         (bVar13 = operator!=((QByteArray *)(p_Var18 + 1),(QByteArray *)(p_Var17 + 1)), bVar13)) {
        p_Var27 = p_Var17[1]._M_parent;
        if (p_Var27 == (_Base_ptr)0x0) {
          p_Var27 = (_Base_ptr)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,
                "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n",
                p_Var27);
      }
    }
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    bVar10 = true;
    bVar9 = true;
    bVar13 = true;
  }
  lVar28 = (this->cdef->propertyList).d.size;
  if (lVar28 != 0) {
    pPVar3 = (this->cdef->propertyList).d.ptr;
    lVar40 = 0;
    bVar29 = 0;
    bVar41 = false;
    bVar15 = false;
    bVar12 = false;
    bVar44 = false;
    do {
      bVar6 = bVar44;
      bVar5 = bVar12;
      bVar44 = true;
      if ((*(long *)((long)&(pPVar3->read).d.size + lVar40) != 0) ||
         (bVar44 = *(long *)((long)&(pPVar3->member).d.size + lVar40) != 0,
         *(long *)((long)&(pPVar3->member).d.size + lVar40) != 0)) {
        bVar41 = (bool)(bVar41 | *(int *)((long)&pPVar3->gspec + lVar40) - 3U < 0xfffffffe);
      }
      bVar31 = 1;
      if (*(long *)((long)&(pPVar3->write).d.size + lVar40) == 0) {
        if (*(long *)((long)&(pPVar3->member).d.size + lVar40) == 0) {
          bVar31 = 0;
        }
        else {
          bVar31 = (&pPVar3->constant)[lVar40] ^ 1;
        }
      }
      bVar15 = (bool)(bVar44 | bVar15);
      bVar29 = bVar29 & 1 | bVar31;
      bVar45 = *(long *)((long)&(pPVar3->reset).d.size + lVar40) != 0;
      bVar44 = (bool)(bVar6 | bVar45);
      bVar46 = *(long *)((long)&(pPVar3->bind).d.size + lVar40) != 0;
      lVar40 = lVar40 + 0x158;
      bVar12 = (bool)(bVar5 | bVar46);
    } while (lVar28 * 0x158 - lVar40 != 0);
    if (bVar6 || bVar45) {
      bVar8 = true;
      bVar13 = true;
      bVar9 = true;
    }
    if ((bVar15 || bVar29 != 0) || (bVar5 || bVar46)) {
      bVar8 = true;
      bVar13 = true;
      bVar9 = true;
    }
    bVar12 = true;
    if ((!bVar15 && bVar29 == 0) && (!bVar5 && !bVar46)) {
      bVar12 = bVar10;
    }
    bVar10 = bVar12;
    if (bVar15) {
      fwrite("    if (_c == QMetaObject::ReadProperty) {\n",0x2b,1,(FILE *)this->out);
      if (bVar41) {
        fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      }
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar25 = this->cdef;
      if (0 < (int)(pCVar25->propertyList).d.size) {
        lVar28 = 0x120;
        local_b0 = 0;
        do {
          pPVar3 = (pCVar25->propertyList).d.ptr;
          if ((*(long *)((long)pPVar3 + lVar28 + -200) != 0) ||
             (*(long *)((long)pPVar3 + lVar28 + -0xe0) != 0)) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar3->name).d.size + lVar28) != 0) {
              local_50._0_8_ = (long)&(pPVar3->name).d.d + lVar28;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            iVar1 = *(int *)((long)&(pPVar3->type).d.d + lVar28 + 4);
            pCVar25 = (ClassDef *)local_88._8_8_;
            if (iVar1 == 1) {
              pFVar22 = (FILE *)this->out;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pCVar25 = (ClassDef *)&QByteArray::_empty;
              }
              puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xd0);
              if (puVar26 == (undefined8 *)0x0) {
                puVar26 = &QByteArray::_empty;
              }
              pcVar23 = 
              "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n"
              ;
LAB_0010bb3c:
              fprintf(pFVar22,pcVar23,local_b0,pCVar25,puVar26);
            }
            else {
              if (iVar1 == 2) {
                pFVar22 = (FILE *)this->out;
                if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                  pCVar25 = (ClassDef *)&QByteArray::_empty;
                }
                puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xd0);
                if (puVar26 == (undefined8 *)0x0) {
                  puVar26 = &QByteArray::_empty;
                }
                pcVar23 = 
                "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n"
                ;
                goto LAB_0010bb3c;
              }
              pCVar25 = this->cdef;
              local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
              pQVar4 = (pCVar25->super_BaseDef).enumDeclarations.d.d.ptr;
              pp_Var21 = (_Base_ptr *)local_50;
              if (pQVar4 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                             *)0x0) {
                cVar19 = std::
                         _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                         ::find(&(pQVar4->m)._M_t,(key_type *)((long)pPVar3 + lVar28 + -0x108));
                pp_Var21 = (_Base_ptr *)local_50;
                if ((_Rb_tree_header *)cVar19._M_node !=
                    &(((pCVar25->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
                     super__Rb_tree_header) {
                  pp_Var21 = &cVar19._M_node[1]._M_right;
                }
              }
              if (((ulong)*pp_Var21 & 1) == 0) {
                local_50._0_8_ = "default";
                bVar15 = operator==((QByteArray *)((long)pPVar3 + lVar28 + -0xd8),(char **)local_50)
                ;
                pCVar33 = (ClassDef *)local_88._8_8_;
                if (bVar15) {
                  uVar16 = *(uint *)((long)&(pPVar3->type).d.ptr + lVar28 + 4);
                  if ((uVar16 & 4) == 0) {
                    pcVar23 = "class ";
                    if (((uVar16 & 2) == 0) && (pcVar23 = "", (uVar16 & 1) != 0)) {
                      pcVar23 = "struct ";
                    }
                  }
                  else {
                    pcVar23 = "enum class ";
                    if (((uVar16 & 2) == 0) && (pcVar23 = "enum ", (uVar16 & 1) != 0)) {
                      pcVar23 = "enum struct ";
                    }
                  }
                  pFVar22 = (FILE *)this->out;
                  pCVar25 = *(ClassDef **)((long)pPVar3 + lVar28 + -0x100);
                  if (pCVar25 == (ClassDef *)0x0) {
                    pCVar25 = (ClassDef *)&QByteArray::_empty;
                  }
                  if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                    pCVar33 = (ClassDef *)&QByteArray::_empty;
                  }
                  pcVar30 = 
                  "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n";
                }
                else {
                  pFVar22 = (FILE *)this->out;
                  uVar16 = *(uint *)((long)&(pPVar3->type).d.ptr + lVar28 + 4);
                  if (*(long *)((long)pPVar3 + lVar28 + -200) == 0) {
                    if ((uVar16 & 4) == 0) {
                      pcVar23 = "class ";
                      if (((uVar16 & 2) == 0) && (pcVar23 = "", (uVar16 & 1) != 0)) {
                        pcVar23 = "struct ";
                      }
                    }
                    else {
                      pcVar23 = "enum class ";
                      if (((uVar16 & 2) == 0) && (pcVar23 = "enum ", (uVar16 & 1) != 0)) {
                        pcVar23 = "enum struct ";
                      }
                    }
                    pCVar25 = *(ClassDef **)((long)pPVar3 + lVar28 + -0x100);
                    if (pCVar25 == (ClassDef *)0x0) {
                      pCVar25 = (ClassDef *)&QByteArray::_empty;
                    }
                    if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                      pCVar33 = (ClassDef *)&QByteArray::_empty;
                    }
                    pcVar30 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n";
                  }
                  else {
                    if ((uVar16 & 4) == 0) {
                      pcVar23 = "class ";
                      if (((uVar16 & 2) == 0) && (pcVar23 = "", (uVar16 & 1) != 0)) {
                        pcVar23 = "struct ";
                      }
                    }
                    else {
                      pcVar23 = "enum class ";
                      if (((uVar16 & 2) == 0) && (pcVar23 = "enum ", (uVar16 & 1) != 0)) {
                        pcVar23 = "enum struct ";
                      }
                    }
                    pCVar25 = *(ClassDef **)((long)pPVar3 + lVar28 + -0x100);
                    if (pCVar25 == (ClassDef *)0x0) {
                      pCVar25 = (ClassDef *)&QByteArray::_empty;
                    }
                    if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                      pCVar33 = (ClassDef *)&QByteArray::_empty;
                    }
                    pcVar30 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n";
                  }
                }
              }
              else {
                pFVar22 = (FILE *)this->out;
                pcVar23 = *(char **)((long)pPVar3 + lVar28 + -0x100);
                if (pcVar23 == (char *)0x0) {
                  pcVar23 = (char *)&QByteArray::_empty;
                }
                pCVar25 = (ClassDef *)local_88._8_8_;
                if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                  pCVar25 = (ClassDef *)&QByteArray::_empty;
                }
                pCVar33 = *(ClassDef **)((long)pPVar3 + lVar28 + -0xd0);
                if (pCVar33 == (ClassDef *)0x0) {
                  pCVar33 = (ClassDef *)&QByteArray::_empty;
                }
                pcVar30 = "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n";
              }
              fprintf(pFVar22,pcVar30,local_b0,pcVar23,pCVar25,pCVar33);
            }
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
          local_b0 = local_b0 + 1;
          pCVar25 = this->cdef;
          lVar28 = lVar28 + 0x158;
        } while (local_b0 < (int)(pCVar25->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar29 != 0) {
      fwrite("    if (_c == QMetaObject::WriteProperty) {\n",0x2c,1,(FILE *)this->out);
      fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar25 = this->cdef;
      if (0 < (int)(pCVar25->propertyList).d.size) {
        lVar28 = 0x120;
        uVar38 = 0;
        do {
          pPVar3 = (pCVar25->propertyList).d.ptr;
          if ((*(char *)((long)&(pPVar3->type).d.size + lVar28) == '\0') &&
             ((*(long *)((long)pPVar3 + lVar28 + -0xb0) != 0 ||
              (*(long *)((long)pPVar3 + lVar28 + -0xe0) != 0)))) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar3->name).d.size + lVar28) != 0) {
              local_50._0_8_ = (long)&(pPVar3->name).d.d + lVar28;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            local_50._0_8_ = "default";
            bVar15 = operator==((QByteArray *)((long)pPVar3 + lVar28 + -0xc0),(char **)local_50);
            if (bVar15) {
              fprintf((FILE *)this->out,"        case %d: {\n",uVar38 & 0xffffffff);
              pCVar25 = (ClassDef *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pCVar25 = (ClassDef *)&QByteArray::_empty;
              }
              puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xa0);
              if (puVar26 == (undefined8 *)0x0) {
                puVar26 = &QByteArray::_empty;
              }
              uVar16 = *(uint *)((long)&(pPVar3->type).d.ptr + lVar28 + 4);
              if ((uVar16 & 4) == 0) {
                pcVar23 = "class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "struct ";
                  pcVar30 = "";
LAB_0010c098:
                  if ((uVar16 & 1) == 0) {
                    pcVar23 = pcVar30;
                  }
                }
              }
              else {
                pcVar23 = "enum class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "enum struct ";
                  pcVar30 = "enum ";
                  goto LAB_0010c098;
                }
              }
              puVar34 = *(undefined8 **)((long)pPVar3 + lVar28 + -0x100);
              if (puVar34 == (undefined8 *)0x0) {
                puVar34 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,
                      "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",pCVar25,puVar26
                      ,pcVar23,puVar34);
              fwrite("            break;\n",0x13,1,(FILE *)this->out);
              pFVar22 = (FILE *)this->out;
              __size = 10;
              pcVar23 = "        }\n";
LAB_0010c0f1:
              fwrite(pcVar23,__size,1,pFVar22);
            }
            else if (*(long *)((long)pPVar3 + lVar28 + -0xb0) == 0) {
              fprintf((FILE *)this->out,"        case %d:",uVar38 & 0xffffffff);
              pCVar25 = (ClassDef *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pCVar25 = (ClassDef *)&QByteArray::_empty;
              }
              puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xe8);
              if (puVar26 == (undefined8 *)0x0) {
                puVar26 = &QByteArray::_empty;
              }
              uVar16 = *(uint *)((long)&(pPVar3->type).d.ptr + lVar28 + 4);
              if (*(long *)((long)pPVar3 + lVar28 + -8) != 0) {
                if ((uVar16 & 4) == 0) {
                  pcVar23 = "class ";
                  if ((uVar16 & 2) == 0) {
                    pcVar23 = "struct ";
                    pcVar30 = "";
LAB_0010c24d:
                    if ((uVar16 & 1) == 0) {
                      pcVar23 = pcVar30;
                    }
                  }
                }
                else {
                  pcVar23 = "enum class ";
                  if ((uVar16 & 2) == 0) {
                    pcVar23 = "enum struct ";
                    pcVar30 = "enum ";
                    goto LAB_0010c24d;
                  }
                }
                puVar34 = *(undefined8 **)((long)pPVar3 + lVar28 + -0x100);
                if (puVar34 == (undefined8 *)0x0) {
                  puVar34 = &QByteArray::_empty;
                }
                fprintf((FILE *)this->out,
                        "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n"
                        ,pCVar25,puVar26,pcVar23,puVar34);
                puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0x10);
                if (puVar26 == (undefined8 *)0x0) {
                  puVar26 = &QByteArray::_empty;
                }
                fprintf((FILE *)this->out,"                Q_EMIT _t->%s(",puVar26);
                lVar40 = (long)*(int *)((long)&(pPVar3->type).d.d + lVar28);
                if (((-1 < lVar40) &&
                    (pFVar2 = (this->cdef->signalList).d.ptr, pFVar2[lVar40].arguments.d.size == 1))
                   && (bVar15 = operator==(&(pFVar2[lVar40].arguments.d.ptr)->normalizedType,
                                           (QByteArray *)((long)pPVar3 + lVar28 + -0x108)), bVar15))
                {
                  pCVar25 = (ClassDef *)local_88._8_8_;
                  if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                    pCVar25 = (ClassDef *)&QByteArray::_empty;
                  }
                  puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xe8);
                  if (puVar26 == (undefined8 *)0x0) {
                    puVar26 = &QByteArray::_empty;
                  }
                  fprintf((FILE *)this->out,"%s%s",pCVar25,puVar26);
                }
                fwrite(");\n",3,1,(FILE *)this->out);
                pFVar22 = (FILE *)this->out;
                __size = 0x13;
                pcVar23 = "            break;\n";
                goto LAB_0010c0f1;
              }
              if ((uVar16 & 4) == 0) {
                pcVar23 = "class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "struct ";
                  pcVar30 = "";
LAB_0010c35d:
                  if ((uVar16 & 1) == 0) {
                    pcVar23 = pcVar30;
                  }
                }
              }
              else {
                pcVar23 = "enum class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "enum struct ";
                  pcVar30 = "enum ";
                  goto LAB_0010c35d;
                }
              }
              puVar34 = *(undefined8 **)((long)pPVar3 + lVar28 + -0x100);
              if (puVar34 == (undefined8 *)0x0) {
                puVar34 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,
                      " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                      pCVar25,puVar26,pcVar23,puVar34);
            }
            else {
              pCVar25 = (ClassDef *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pCVar25 = (ClassDef *)&QByteArray::_empty;
              }
              puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xb8);
              if (puVar26 == (undefined8 *)0x0) {
                puVar26 = &QByteArray::_empty;
              }
              uVar16 = *(uint *)((long)&(pPVar3->type).d.ptr + lVar28 + 4);
              if ((uVar16 & 4) == 0) {
                pcVar23 = "class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "struct ";
                  pcVar30 = "";
LAB_0010c189:
                  if ((uVar16 & 1) == 0) {
                    pcVar23 = pcVar30;
                  }
                }
              }
              else {
                pcVar23 = "enum class ";
                if ((uVar16 & 2) == 0) {
                  pcVar23 = "enum struct ";
                  pcVar30 = "enum ";
                  goto LAB_0010c189;
                }
              }
              puVar34 = *(undefined8 **)((long)pPVar3 + lVar28 + -0x100);
              if (puVar34 == (undefined8 *)0x0) {
                puVar34 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,
                      "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                      uVar38 & 0xffffffff,pCVar25,puVar26,pcVar23,puVar34);
            }
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
          uVar38 = uVar38 + 1;
          pCVar25 = this->cdef;
          lVar28 = lVar28 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar25->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar44) {
      fwrite("if (_c == QMetaObject::ResetProperty) {\n",0x28,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar25 = this->cdef;
      if (0 < (int)(pCVar25->propertyList).d.size) {
        lVar28 = 0x98;
        uVar38 = 0;
        do {
          pPVar3 = (pCVar25->propertyList).d.ptr;
          if (*(long *)((long)&(pPVar3->name).d.ptr + lVar28) != 0) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar3->reset).d.ptr + lVar28) != 0) {
              local_50._0_8_ = (long)&(pPVar3->bind).d.size + lVar28;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            pCVar25 = (ClassDef *)local_88._8_8_;
            if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
              pCVar25 = (ClassDef *)&QByteArray::_empty;
            }
            puVar26 = *(undefined8 **)((long)&(pPVar3->name).d.d + lVar28);
            if (puVar26 == (undefined8 *)0x0) {
              puVar26 = &QByteArray::_empty;
            }
            fprintf((FILE *)this->out,"        case %d: %s%s(); break;\n",uVar38 & 0xffffffff,
                    pCVar25,puVar26);
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
          uVar38 = uVar38 + 1;
          pCVar25 = this->cdef;
          lVar28 = lVar28 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar25->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if ((bool)(bVar5 | bVar46)) {
      fwrite("    if (_c == QMetaObject::BindableProperty) {\n",0x2f,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar25 = this->cdef;
      if (0 < (int)(pCVar25->propertyList).d.size) {
        lVar28 = 0x120;
        uVar38 = 0;
        do {
          pPVar3 = (pCVar25->propertyList).d.ptr;
          if (*(long *)((long)pPVar3 + lVar28 + -0x98) != 0) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar3->name).d.size + lVar28) != 0) {
              local_50._0_8_ = (long)&(pPVar3->name).d.d + lVar28;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            pCVar25 = (ClassDef *)local_88._8_8_;
            if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
              pCVar25 = (ClassDef *)&QByteArray::_empty;
            }
            puVar26 = *(undefined8 **)((long)pPVar3 + lVar28 + -0xa0);
            if (puVar26 == (undefined8 *)0x0) {
              puVar26 = &QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); break;\n",
                    uVar38 & 0xffffffff,pCVar25,puVar26);
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
          uVar38 = uVar38 + 1;
          pCVar25 = this->cdef;
          lVar28 = lVar28 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar25->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
  }
  if (!bVar8) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_t");
  }
  if (!bVar13) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_c");
  }
  if (!bVar9) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_id");
  }
  if (!bVar10) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_a");
  }
  fwrite("}\n",2,1,(FILE *)this->out);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_90);
  QArrayDataPointer<FunctionDef>::~QArrayDataPointer
            ((QArrayDataPointer<FunctionDef> *)(local_88 + 0x20));
  if (*(char **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateStaticMetacall()
{
    fprintf(out, "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
            cdef->qualified.constData());

    enum UsedArgs {
        UsedT = 1,
        UsedC = 2,
        UsedId = 4,
        UsedA = 8,
    };
    uint usedArgs = 0;

    if (cdef->hasQObject) {
#ifndef QT_NO_DEBUG
        fprintf(out, "    Q_ASSERT(_o == nullptr || staticMetaObject.cast(_o));\n");
#endif
        fprintf(out, "    auto *_t = static_cast<%s *>(_o);\n", cdef->classname.constData());
    } else {
        fprintf(out, "    auto *_t = reinterpret_cast<%s *>(_o);\n", cdef->classname.constData());
    }

    const auto generateCtorArguments = [&](int ctorindex) {
        const FunctionDef &f = cdef->constructorList.at(ctorindex);
        Q_ASSERT(!f.isPrivateSignal); // That would be a strange ctor indeed
        int offset = 1;

        const auto begin = f.arguments.cbegin();
        const auto end = f.arguments.cend();
        for (auto it = begin; it != end; ++it) {
            const ArgumentDef &a = *it;
            if (it != begin)
                fprintf(out, ",");
            fprintf(out, "(*reinterpret_cast<%s>(_a[%d]))",
                    a.typeNameForCast.constData(), offset++);
        }
    };

    if (!cdef->constructorList.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::CreateInstance) {\n");
        fprintf(out, "        switch (_id) {\n");
        const int ctorend = int(cdef->constructorList.size());
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { %s *_r = new %s(", ctorindex,
                    cdef->classname.constData(), cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, ");\n");
            fprintf(out, "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",
                    (cdef->hasQGadget || cdef->hasQNamespace) ? "void" : "QObject");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        fprintf(out, "    if (_c == QMetaObject::ConstructInPlace) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { new (_a[0]) %s(",
                    ctorindex, cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, "); } break;\n");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    if (!methodList.isEmpty()) {
        usedArgs |= UsedT | UsedC | UsedId;
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int methodindex = 0; methodindex < methodList.size(); ++methodindex) {
            const FunctionDef &f = methodList.at(methodindex);
            Q_ASSERT(!f.normalizedType.isEmpty());
            fprintf(out, "        case %d: ", methodindex);
            if (f.normalizedType != "void")
                fprintf(out, "{ %s _r = ", noRef(f.normalizedType).constData());
            fprintf(out, "_t->");
            if (f.inPrivateClass.size())
                fprintf(out, "%s->", f.inPrivateClass.constData());
            fprintf(out, "%s(", f.name.constData());
            int offset = 1;

            if (f.isRawSlot) {
                fprintf(out, "QMethodRawArguments{ _a }");
                usedArgs |= UsedA;
            } else {
                const auto begin = f.arguments.cbegin();
                const auto end = f.arguments.cend();
                for (auto it = begin; it != end; ++it) {
                    const ArgumentDef &a = *it;
                    if (it != begin)
                        fprintf(out, ",");
                    fprintf(out, "(*reinterpret_cast< %s>(_a[%d]))",a.typeNameForCast.constData(), offset++);
                    usedArgs |= UsedA;
                }
                if (f.isPrivateSignal) {
                    if (!f.arguments.isEmpty())
                        fprintf(out, ", ");
                    fprintf(out, "%s", "QPrivateSignal()");
                }
            }
            fprintf(out, ");");
            if (f.normalizedType != "void") {
                fprintf(out, "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                        noRef(f.normalizedType).constData());
                usedArgs |= UsedA;
            }
            fprintf(out, " break;\n");
        }
        fprintf(out, "        default: ;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");

        QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes = methodsWithAutomaticTypesHelper(methodList);

        if (!methodsWithAutomaticTypes.isEmpty()) {
            fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
            fprintf(out, "        switch (_id) {\n");
            fprintf(out, "        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
            QMap<int, QMultiMap<QByteArray, int> >::const_iterator it = methodsWithAutomaticTypes.constBegin();
            const QMap<int, QMultiMap<QByteArray, int> >::const_iterator end = methodsWithAutomaticTypes.constEnd();
            for ( ; it != end; ++it) {
                fprintf(out, "        case %d:\n", it.key());
                fprintf(out, "            switch (*reinterpret_cast<int*>(_a[1])) {\n");
                fprintf(out, "            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
                auto jt = it->begin();
                const auto jend = it->end();
                while (jt != jend) {
                    fprintf(out, "            case %d:\n", jt.value());
                    const QByteArray &lastKey = jt.key();
                    ++jt;
                    if (jt == jend || jt.key() != lastKey)
                        fprintf(out, "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n", lastKey.constData());
                }
                fprintf(out, "            }\n");
                fprintf(out, "            break;\n");
            }
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
            usedArgs |= UsedC | UsedId | UsedA;
        }

    }
    if (!cdef->signalList.isEmpty()) {
        usedArgs |= UsedC | UsedA;
        fprintf(out, "    if (_c == QMetaObject::IndexOfMethod) {\n");
        for (int methodindex = 0; methodindex < int(cdef->signalList.size()); ++methodindex) {
            const FunctionDef &f = cdef->signalList.at(methodindex);
            if (f.wasCloned || !f.inPrivateClass.isEmpty() || f.isStatic)
                continue;
            fprintf(out, "        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",
                    f.type.rawName.constData() , cdef->classname.constData());

            const auto begin = f.arguments.cbegin();
            const auto end = f.arguments.cend();
            for (auto it = begin; it != end; ++it) {
                const ArgumentDef &a = *it;
                if (it != begin)
                    fprintf(out, ", ");
                fprintf(out, "%s", QByteArray(a.type.name + ' ' + a.rightType).constData());
            }
            if (f.isPrivateSignal) {
                if (!f.arguments.isEmpty())
                    fprintf(out, ", ");
                fprintf(out, "%s", "QPrivateSignal");
            }
            fprintf(out, ")%s>(_a, &%s::%s, %d))\n",
                    f.isConst ? " const" : "",
                    cdef->classname.constData(), f.name.constData(), methodindex);
            fprintf(out, "            return;\n");
        }
        fprintf(out, "    }\n");
    }

    const QMultiMap<QByteArray, int> automaticPropertyMetaTypes = automaticPropertyMetaTypesHelper();

    if (!automaticPropertyMetaTypes.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::RegisterPropertyMetaType) {\n");
        fprintf(out, "        switch (_id) {\n");
        fprintf(out, "        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n");
        auto it = automaticPropertyMetaTypes.begin();
        const auto end = automaticPropertyMetaTypes.end();
        while (it != end) {
            fprintf(out, "        case %d:\n", it.value());
            const QByteArray &lastKey = it.key();
            ++it;
            if (it == end || it.key() != lastKey)
                fprintf(out, "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n", lastKey.constData());
        }
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    if (!cdef->propertyList.empty()) {
        bool needGet = false;
        bool needTempVarForGet = false;
        bool needSet = false;
        bool needReset = false;
        bool hasBindableProperties = false;
        for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
            needGet |= !p.read.isEmpty() || !p.member.isEmpty();
            if (!p.read.isEmpty() || !p.member.isEmpty())
                needTempVarForGet |= (p.gspec != PropertyDef::PointerSpec
                                      && p.gspec != PropertyDef::ReferenceSpec);

            needSet |= !p.write.isEmpty() || (!p.member.isEmpty() && !p.constant);
            needReset |= !p.reset.isEmpty();
            hasBindableProperties |= !p.bind.isEmpty();
        }
        if (needGet || needSet || hasBindableProperties || needReset)
            usedArgs |= UsedT | UsedC | UsedId;
        if (needGet || needSet || hasBindableProperties)
            usedArgs |= UsedA;  // resetting doesn't need arguments

        if (needGet) {
            fprintf(out, "    if (_c == QMetaObject::ReadProperty) {\n");
            if (needTempVarForGet)
                fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.read.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }

                if (p.gspec == PropertyDef::PointerSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
                else if (p.gspec == PropertyDef::ReferenceSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
                else if (auto eflags = cdef->enumDeclarations.value(p.type); eflags & EnumIsFlag)
                    fprintf(out, "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n",
                            propindex, p.type.constData(), prefix.constData(), p.read.constData());
#endif
                else if (p.read == "default")
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.bind.constData());
                else if (!p.read.isEmpty())
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.read.constData());
                else
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.member.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needSet) {
            fprintf(out, "    if (_c == QMetaObject::WriteProperty) {\n");
            fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.constant)
                    continue;
                if (p.write.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                if (p.write == "default") {
                    fprintf(out, "        case %d: {\n", propindex);
                    fprintf(out, "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",
                            prefix.constData(), p.bind.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    fprintf(out, "            break;\n");
                    fprintf(out, "        }\n");
                } else if (!p.write.isEmpty()) {
                    fprintf(out, "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                            propindex, prefix.constData(), p.write.constData(),
                            cxxTypeTag(p.typeTag), p.type.constData());
                } else {
                    fprintf(out, "        case %d:", propindex);
                    if (p.notify.isEmpty()) {
                        fprintf(out, " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    } else {
                        fprintf(out, "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                        fprintf(out, "                Q_EMIT _t->%s(", p.notify.constData());
                        if (p.notifyId > -1) {
                            const FunctionDef &f = cdef->signalList.at(p.notifyId);
                            if (f.arguments.size() == 1 && f.arguments.at(0).normalizedType == p.type)
                                fprintf(out, "%s%s", prefix.constData(), p.member.constData());
                        }
                        fprintf(out, ");\n");
                        fprintf(out, "            break;\n");
                    }
                }
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needReset) {
            fprintf(out, "if (_c == QMetaObject::ResetProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.reset.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out, "        case %d: %s%s(); break;\n",
                        propindex, prefix.constData(), p.reset.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (hasBindableProperties) {
            fprintf(out, "    if (_c == QMetaObject::BindableProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.bind.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out,
                        "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); "
                        "break;\n",
                        propindex, prefix.constData(), p.bind.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }
    }

    auto printUnused = [&](UsedArgs entry, const char *name) {
        if ((usedArgs & entry) == 0)
            fprintf(out, "    (void)%s;\n", name);
    };
    printUnused(UsedT, "_t");
    printUnused(UsedC, "_c");
    printUnused(UsedId, "_id");
    printUnused(UsedA, "_a");

    fprintf(out, "}\n");
}